

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O2

void ReconstructRow(VP8Decoder *dec,VP8ThreadContext *ctx)

{
  uint8_t *puVar1;
  int *piVar2;
  uint8_t *dst;
  byte bVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint8_t *puVar8;
  VP8MBData *pVVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  undefined8 uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  VP8TopSamples *pVVar18;
  ulong uVar19;
  uint8_t *puVar20;
  int16_t *piVar21;
  byte *pbVar22;
  uint8_t *puVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  uint32_t uVar28;
  
  iVar5 = ctx->mb_y_;
  iVar6 = ctx->id_;
  puVar8 = dec->yuv_b_;
  for (lVar14 = 0; lVar14 != 0x200; lVar14 = lVar14 + 0x20) {
    puVar8[lVar14 + 0x27] = 0x81;
  }
  dst = puVar8 + 600;
  for (lVar14 = 0; lVar14 != 0x100; lVar14 = lVar14 + 0x20) {
    puVar8[lVar14 + 0x247] = 0x81;
    puVar8[lVar14 + 599] = 0x81;
  }
  if (iVar5 < 1) {
    builtin_memcpy(puVar8 + 7,
                   "\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                   ,0x15);
    builtin_memcpy(puVar8 + 0x227,"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f",9);
    builtin_memcpy(puVar8 + 0x237,"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f",9);
  }
  else {
    puVar8[0x237] = 0x81;
    puVar8[0x227] = 0x81;
    puVar8[7] = 0x81;
  }
  puVar1 = puVar8 + 0x28;
  piVar2 = (int *)(puVar8 + 0x18);
  uVar17 = (ulong)((uint)(iVar5 == 0) * 4);
  uVar15 = (ulong)(iVar5 == 0) + 5;
  lVar14 = 0x301;
  lVar27 = 0;
  lVar26 = 0;
  do {
    if (dec->mb_w_ <= lVar26) {
      return;
    }
    pVVar9 = ctx->mb_data_;
    if (lVar26 != 0) {
      for (lVar16 = 0x14; lVar16 != 0x234; lVar16 = lVar16 + 0x20) {
        *(undefined4 *)(puVar8 + lVar16 + -0x10) = *(undefined4 *)(puVar8 + lVar16);
      }
      for (lVar16 = 0; lVar16 != 0x120; lVar16 = lVar16 + 0x20) {
        *(undefined4 *)(puVar8 + lVar16 + 0x224) = *(undefined4 *)(puVar8 + lVar16 + 0x22c);
        *(undefined4 *)(puVar8 + lVar16 + 0x234) = *(undefined4 *)(puVar8 + lVar16 + 0x23c);
      }
    }
    pVVar18 = dec->yuv_t_ + lVar26;
    uVar28 = pVVar9[lVar26].non_zero_y_;
    uVar25 = uVar17;
    if (iVar5 < 1) {
      if (pVVar9[lVar26].is_i4x4_ != '\0') {
        iVar13 = *piVar2;
        goto LAB_00121eea;
      }
LAB_00121e5c:
      if (lVar26 == 0) {
        uVar25 = uVar15;
      }
      uVar19 = uVar25;
      if (pVVar9[lVar26].imodes_[0] != 0) {
        uVar19 = (ulong)pVVar9[lVar26].imodes_[0];
      }
      (*VP8PredLuma16[uVar19])(puVar1);
      if (uVar28 != 0) {
        piVar21 = (int16_t *)((long)pVVar9->coeffs_ + lVar27);
        for (lVar16 = 0; lVar16 != 0x20; lVar16 = lVar16 + 2) {
          DoTransform(uVar28,piVar21,puVar1 + *(ushort *)((long)kScan + lVar16));
          uVar28 = uVar28 << 2;
          piVar21 = piVar21 + 0x10;
        }
      }
    }
    else {
      uVar12 = *(undefined8 *)(pVVar18->y + 8);
      *(undefined8 *)(puVar8 + 8) = *(undefined8 *)pVVar18->y;
      *(undefined8 *)(puVar8 + 0x10) = uVar12;
      *(undefined8 *)(puVar8 + 0x228) = *(undefined8 *)pVVar18->u;
      *(undefined8 *)(puVar8 + 0x238) = *(undefined8 *)pVVar18->v;
      if (pVVar9[lVar26].is_i4x4_ == '\0') goto LAB_00121e5c;
      if (lVar26 < (long)dec->mb_w_ + -1) {
        iVar13 = *(int *)pVVar18[1].y;
        *piVar2 = iVar13;
      }
      else {
        bVar3 = pVVar18->y[0xf];
        *piVar2 = (uint)bVar3 * 0x1010101;
        iVar13 = CONCAT22(CONCAT11(bVar3,bVar3),CONCAT11(bVar3,bVar3));
      }
LAB_00121eea:
      *(int *)(puVar8 + 0x198) = iVar13;
      *(int *)(puVar8 + 0x118) = iVar13;
      *(int *)(puVar8 + 0x98) = iVar13;
      piVar21 = (int16_t *)((long)pVVar9->coeffs_ + lVar27);
      pbVar22 = (byte *)((long)pVVar9->coeffs_ + lVar14);
      for (lVar16 = 0; lVar16 != 0x20; lVar16 = lVar16 + 2) {
        uVar4 = *(ushort *)((long)kScan + lVar16);
        (*VP8PredLuma4[*pbVar22])(puVar1 + uVar4);
        DoTransform(uVar28,piVar21,puVar1 + uVar4);
        uVar28 = uVar28 << 2;
        piVar21 = piVar21 + 0x10;
        pbVar22 = pbVar22 + 1;
      }
      if (lVar26 == 0) {
        uVar25 = uVar15;
      }
    }
    uVar28 = pVVar9[lVar26].non_zero_uv_;
    if (pVVar9[lVar26].uvmode_ != 0) {
      uVar25 = (ulong)pVVar9[lVar26].uvmode_;
    }
    (*VP8PredChroma8[uVar25])(puVar8 + 0x248);
    (*VP8PredChroma8[uVar25])(dst);
    DoUVTransform(uVar28,pVVar9[lVar26].coeffs_ + 0x100,puVar8 + 0x248);
    DoUVTransform(uVar28 >> 8,pVVar9[lVar26].coeffs_ + 0x140,dst);
    if (iVar5 < dec->mb_h_ + -1) {
      uVar12 = *(undefined8 *)(puVar8 + 0x210);
      *(undefined8 *)pVVar18->y = *(undefined8 *)(puVar8 + 0x208);
      *(undefined8 *)(pVVar18->y + 8) = uVar12;
      *(undefined8 *)pVVar18->u = *(undefined8 *)(puVar8 + 0x328);
      *(undefined8 *)pVVar18->v = *(undefined8 *)(puVar8 + 0x338);
    }
    iVar13 = dec->cache_y_stride_;
    puVar20 = dec->cache_y_;
    lVar16 = (long)dec->cache_uv_stride_ * (long)iVar6 * 8;
    puVar10 = dec->cache_u_;
    puVar11 = dec->cache_v_;
    puVar23 = puVar1;
    for (lVar24 = 0; lVar24 != 0x10; lVar24 = lVar24 + 1) {
      iVar7 = dec->cache_y_stride_;
      uVar12 = *(undefined8 *)(puVar23 + 8);
      *(undefined8 *)
       (puVar20 +
       (long)(int)lVar24 * (long)iVar7 + (long)iVar13 * (long)iVar6 * 0x10 + lVar26 * 0x10) =
           *(undefined8 *)puVar23;
      *(undefined8 *)
       (puVar20 + (long)(int)lVar24 * (long)iVar7 +
                  (long)iVar13 * (long)iVar6 * 0x10 + lVar26 * 0x10 + 8) = uVar12;
      puVar23 = puVar23 + 0x20;
    }
    puVar20 = dst;
    for (lVar24 = 0; lVar24 != 8; lVar24 = lVar24 + 1) {
      *(undefined8 *)
       (puVar10 + (long)dec->cache_uv_stride_ * (long)(int)lVar24 + lVar16 + lVar26 * 8) =
           *(undefined8 *)(puVar20 + -0x10);
      *(undefined8 *)
       (puVar11 + (long)dec->cache_uv_stride_ * (long)(int)lVar24 + lVar16 + lVar26 * 8) =
           *(undefined8 *)puVar20;
      puVar20 = puVar20 + 0x20;
    }
    lVar26 = lVar26 + 1;
    lVar27 = lVar27 + 800;
    lVar14 = lVar14 + 800;
  } while( true );
}

Assistant:

static void ReconstructRow(const VP8Decoder* const dec,
                           const VP8ThreadContext* ctx) {
  int j;
  int mb_x;
  const int mb_y = ctx->mb_y_;
  const int cache_id = ctx->id_;
  uint8_t* const y_dst = dec->yuv_b_ + Y_OFF;
  uint8_t* const u_dst = dec->yuv_b_ + U_OFF;
  uint8_t* const v_dst = dec->yuv_b_ + V_OFF;

  // Initialize left-most block.
  for (j = 0; j < 16; ++j) {
    y_dst[j * BPS - 1] = 129;
  }
  for (j = 0; j < 8; ++j) {
    u_dst[j * BPS - 1] = 129;
    v_dst[j * BPS - 1] = 129;
  }

  // Init top-left sample on left column too.
  if (mb_y > 0) {
    y_dst[-1 - BPS] = u_dst[-1 - BPS] = v_dst[-1 - BPS] = 129;
  } else {
    // we only need to do this init once at block (0,0).
    // Afterward, it remains valid for the whole topmost row.
    memset(y_dst - BPS - 1, 127, 16 + 4 + 1);
    memset(u_dst - BPS - 1, 127, 8 + 1);
    memset(v_dst - BPS - 1, 127, 8 + 1);
  }

  // Reconstruct one row.
  for (mb_x = 0; mb_x < dec->mb_w_; ++mb_x) {
    const VP8MBData* const block = ctx->mb_data_ + mb_x;

    // Rotate in the left samples from previously decoded block. We move four
    // pixels at a time for alignment reason, and because of in-loop filter.
    if (mb_x > 0) {
      for (j = -1; j < 16; ++j) {
        Copy32b(&y_dst[j * BPS - 4], &y_dst[j * BPS + 12]);
      }
      for (j = -1; j < 8; ++j) {
        Copy32b(&u_dst[j * BPS - 4], &u_dst[j * BPS + 4]);
        Copy32b(&v_dst[j * BPS - 4], &v_dst[j * BPS + 4]);
      }
    }
    {
      // bring top samples into the cache
      VP8TopSamples* const top_yuv = dec->yuv_t_ + mb_x;
      const int16_t* const coeffs = block->coeffs_;
      uint32_t bits = block->non_zero_y_;
      int n;

      if (mb_y > 0) {
        memcpy(y_dst - BPS, top_yuv[0].y, 16);
        memcpy(u_dst - BPS, top_yuv[0].u, 8);
        memcpy(v_dst - BPS, top_yuv[0].v, 8);
      }

      // predict and add residuals
      if (block->is_i4x4_) {   // 4x4
        uint32_t* const top_right = (uint32_t*)(y_dst - BPS + 16);

        if (mb_y > 0) {
          if (mb_x >= dec->mb_w_ - 1) {    // on rightmost border
            memset(top_right, top_yuv[0].y[15], sizeof(*top_right));
          } else {
            memcpy(top_right, top_yuv[1].y, sizeof(*top_right));
          }
        }
        // replicate the top-right pixels below
        top_right[BPS] = top_right[2 * BPS] = top_right[3 * BPS] = top_right[0];

        // predict and add residuals for all 4x4 blocks in turn.
        for (n = 0; n < 16; ++n, bits <<= 2) {
          uint8_t* const dst = y_dst + kScan[n];
          VP8PredLuma4[block->imodes_[n]](dst);
          DoTransform(bits, coeffs + n * 16, dst);
        }
      } else {    // 16x16
        const int pred_func = CheckMode(mb_x, mb_y, block->imodes_[0]);
        VP8PredLuma16[pred_func](y_dst);
        if (bits != 0) {
          for (n = 0; n < 16; ++n, bits <<= 2) {
            DoTransform(bits, coeffs + n * 16, y_dst + kScan[n]);
          }
        }
      }
      {
        // Chroma
        const uint32_t bits_uv = block->non_zero_uv_;
        const int pred_func = CheckMode(mb_x, mb_y, block->uvmode_);
        VP8PredChroma8[pred_func](u_dst);
        VP8PredChroma8[pred_func](v_dst);
        DoUVTransform(bits_uv >> 0, coeffs + 16 * 16, u_dst);
        DoUVTransform(bits_uv >> 8, coeffs + 20 * 16, v_dst);
      }

      // stash away top samples for next block
      if (mb_y < dec->mb_h_ - 1) {
        memcpy(top_yuv[0].y, y_dst + 15 * BPS, 16);
        memcpy(top_yuv[0].u, u_dst +  7 * BPS,  8);
        memcpy(top_yuv[0].v, v_dst +  7 * BPS,  8);
      }
    }
    // Transfer reconstructed samples from yuv_b_ cache to final destination.
    {
      const int y_offset = cache_id * 16 * dec->cache_y_stride_;
      const int uv_offset = cache_id * 8 * dec->cache_uv_stride_;
      uint8_t* const y_out = dec->cache_y_ + mb_x * 16 + y_offset;
      uint8_t* const u_out = dec->cache_u_ + mb_x * 8 + uv_offset;
      uint8_t* const v_out = dec->cache_v_ + mb_x * 8 + uv_offset;
      for (j = 0; j < 16; ++j) {
        memcpy(y_out + j * dec->cache_y_stride_, y_dst + j * BPS, 16);
      }
      for (j = 0; j < 8; ++j) {
        memcpy(u_out + j * dec->cache_uv_stride_, u_dst + j * BPS, 8);
        memcpy(v_out + j * dec->cache_uv_stride_, v_dst + j * BPS, 8);
      }
    }
  }
}